

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Minefield_Query_PDU::operator==(Minefield_Query_PDU *this,Minefield_Query_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Minefield_Query_PDU *Value_local;
  Minefield_Query_PDU *this_local;
  
  KVar1 = Minefield_Header::operator!=(&this->super_Minefield_Header,&Value->super_Minefield_Header)
  ;
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui8ReqID == Value->m_ui8ReqID) {
      if (this->m_ui8NumPerimPoints == Value->m_ui8NumPerimPoints) {
        if (this->m_ui8NumSensTyp == Value->m_ui8NumSensTyp) {
          KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_MineTypFilter,&Value->m_MineTypFilter);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            bVar2 = std::operator!=(&this->m_vPoints,&Value->m_vPoints);
            if (bVar2) {
              this_local._7_1_ = false;
            }
            else {
              bVar2 = std::operator!=(&this->m_vui16SensorTypes,&Value->m_vui16SensorTypes);
              if (bVar2) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Minefield_Query_PDU::operator == ( const Minefield_Query_PDU & Value ) const
{
    if( Minefield_Header::operator != ( Value ) )                 return false;
    if( m_ReqID                    != Value.m_ReqID )             return false;
    if( m_ui8ReqID                 != Value.m_ui8ReqID )          return false;
    if( m_ui8NumPerimPoints        != Value.m_ui8NumPerimPoints ) return false;
    if( m_ui8NumSensTyp            != Value.m_ui8NumSensTyp )     return false;
    if( m_MineTypFilter            != Value.m_MineTypFilter )     return false;
    if( m_vPoints                  != Value.m_vPoints )           return false;
    if( m_vui16SensorTypes         != Value.m_vui16SensorTypes )  return false;
    return true;
}